

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field_00;
  pointer ppFVar1;
  JavaType JVar2;
  Descriptor *pDVar3;
  FieldGeneratorInfo *pFVar4;
  Descriptor *descriptor;
  AlphaNum *a;
  Descriptor *descriptor_00;
  int i;
  int index;
  pointer ppFVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  FieldDescriptor *field;
  string local_70;
  string local_50;
  
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  if ((pDVar3->options_->field_0)._impl_.no_standard_descriptor_accessor_ == false) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              ((string *)&field,this->name_resolver_,pDVar3->file_);
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_70,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    text._M_str = 
    "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
    ;
    text._M_len = 0x8f;
    io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text,(char (*) [10])"fileclass",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
               (char (*) [11])"identifier",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&field);
  }
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (index = 0; pDVar3 = (this->super_MessageGenerator).descriptor_, index < pDVar3->field_count_;
      index = index + 1) {
    field = Descriptor::field(pDVar3,index);
    JVar2 = GetJavaType(field);
    if (JVar2 == JAVATYPE_MESSAGE) {
      pDVar3 = FieldDescriptor::message_type(field);
      if ((pDVar3->options_->field_0)._impl_.map_entry_ == true) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back(&map_fields,&field);
      }
    }
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    text_00._M_str =
         "@SuppressWarnings({\"rawtypes\"})\n@java.lang.Override\nprotected com.google.protobuf.MapFieldReflectionAccessor internalGetMapFieldReflection(\n    int number) {\n  switch (number) {\n"
    ;
    text_00._M_len = 0xb2;
    io::Printer::Print<>(printer,text_00);
    ppFVar1 = map_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
    for (ppFVar5 = map_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar1;
        ppFVar5 = ppFVar5 + 1) {
      field_00 = *ppFVar5;
      pFVar4 = Context::GetFieldGeneratorInfo(this->context_,field_00);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&field,field_00->number_);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_70,(lts_20250127 *)&field,a);
      text_01._M_str = "case $number$:\n  return internalGet$capitalized_name$();\n";
      text_01._M_len = 0x39;
      io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                (printer,text_01,(char (*) [7])0xe43eb3,&local_70,(char (*) [17])0x1026a39,
                 &pFVar4->capitalized_name);
      std::__cxx11::string::~string((string *)&local_70);
    }
    text_02._M_str =
         "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
    ;
    text_02._M_len = 0x55;
    io::Printer::Print<>(printer,text_02);
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    text_03._M_str = "  }\n}\n";
    text_03._M_len = 6;
    io::Printer::Print<>(printer,text_03);
    pDVar3 = (this->super_MessageGenerator).descriptor_;
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&field,this->name_resolver_,pDVar3);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_70,this->name_resolver_,((this->super_MessageGenerator).descriptor_)->file_);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_50,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  text_04._M_str =
       "@java.lang.Override\nprotected com.google.protobuf.GeneratedMessage.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
  ;
  text_04._M_len = 0x11e;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[10],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,text_04,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
             (char (*) [10])"fileclass",&local_70,(char (*) [11])"identifier",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&field);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&map_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateDescriptorMethods(
    io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "public static final com.google.protobuf.Descriptors.Descriptor\n"
        "    getDescriptor() {\n"
        "  return $fileclass$.internal_$identifier$_descriptor;\n"
        "}\n"
        "\n",
        "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
        "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "@java.lang.Override\n"
        "protected com.google.protobuf.MapFieldReflectionAccessor "
        "internalGetMapFieldReflection(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (const FieldDescriptor* field : map_fields) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGet$capitalized_name$();\n",
          "number", absl::StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
      "@java.lang.Override\n"
      "protected com.google.protobuf.GeneratedMessage.FieldAccessorTable\n"
      "    internalGetFieldAccessorTable() {\n"
      "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
      "      .ensureFieldAccessorsInitialized(\n"
      "          $classname$.class, $classname$.Builder.class);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
}